

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

int P_DetermineTranslucency(int lumpnum)

{
  undefined2 uVar1;
  uint uVar2;
  byte bVar3;
  BYTE index;
  char lumpname [9];
  FWadLump tranmap;
  
  FWadCollection::OpenLumpNum(&tranmap,&Wads,lumpnum);
  FWadLump::Seek(&tranmap,(ulong)(ushort)GPalette._1280_2_,0);
  FWadLump::Read(&tranmap,&index,1);
  uVar1 = *(undefined2 *)((long)&GPalette.BaseColors[GPalette.Remap[index]].field_0 + 2);
  FWadLump::Seek(&tranmap,(ulong)(ushort)(GPalette._1280_2_ << 8 | (ushort)GPalette._1280_2_ >> 8),0
                );
  FWadLump::Read(&tranmap,&index,1);
  bVar3 = (byte)uVar1;
  if ((~GPalette.BaseColors[GPalette.Remap[index]].field_0.d & 0xff0000) == 0) {
    if (2 < developer.Value) {
      lumpname[8] = '\0';
      FWadCollection::GetLumpName(&Wads,lumpname,lumpnum);
      Printf("%s appears to be additive translucency %d (%d%%)\n",lumpname,(ulong)(uint)bVar3,
             (ulong)(ushort)(((uint)bVar3 * 100) / 0xff));
    }
    uVar2 = -(uint)bVar3;
  }
  else if (developer.Value < 3) {
    uVar2 = (uint)bVar3;
  }
  else {
    lumpname[8] = '\0';
    FWadCollection::GetLumpName(&Wads,lumpname,lumpnum);
    uVar2 = (uint)bVar3;
    Printf("%s appears to be translucency %d (%d%%)\n",lumpname,(ulong)(uint)bVar3,
           (ulong)(ushort)(((uint)bVar3 * 100) / 0xff));
  }
  FWadLump::~FWadLump(&tranmap);
  return uVar2;
}

Assistant:

int P_DetermineTranslucency (int lumpnum)
{
	FWadLump tranmap = Wads.OpenLumpNum (lumpnum);
	BYTE index;
	PalEntry newcolor;
	PalEntry newcolor2;

	tranmap.Seek (GPalette.BlackIndex * 256 + GPalette.WhiteIndex, SEEK_SET);
	tranmap.Read (&index, 1);

	newcolor = GPalette.BaseColors[GPalette.Remap[index]];

	tranmap.Seek (GPalette.WhiteIndex * 256 + GPalette.BlackIndex, SEEK_SET);
	tranmap.Read (&index, 1);
	newcolor2 = GPalette.BaseColors[GPalette.Remap[index]];
	if (newcolor2.r == 255)	// if black on white results in white it's either
							// fully transparent or additive
	{
		if (developer >= DMSG_NOTIFY)
		{
			char lumpname[9];
			lumpname[8] = 0;
			Wads.GetLumpName (lumpname, lumpnum);
			Printf ("%s appears to be additive translucency %d (%d%%)\n", lumpname, newcolor.r,
				newcolor.r*100/255);
		}
		return -newcolor.r;
	}

	if (developer >= DMSG_NOTIFY)
	{
		char lumpname[9];
		lumpname[8] = 0;
		Wads.GetLumpName (lumpname, lumpnum);
		Printf ("%s appears to be translucency %d (%d%%)\n", lumpname, newcolor.r,
			newcolor.r*100/255);
	}
	return newcolor.r;
}